

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O2

Name __thiscall CFG::RelooperBuilder::getBlockBreakName(RelooperBuilder *this,int id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  string_view local_28;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"block$",&local_11);
  std::__cxx11::to_string(&local_48,id);
  std::operator+(&local_88,&local_68,&local_48);
  std::operator+(&local_a8,&local_88,"$break");
  ::wasm::IString::IString((IString *)&local_28,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return (IString)(IString)local_28;
}

Assistant:

wasm::Name getBlockBreakName(int id) {
    return wasm::Name(std::string("block$") + std::to_string(id) + "$break");
  }